

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
ProxyListener::ProcessMessage(ProxyListener *this,ReceivedMessage *m,IpEndpointName *remoteEndpoint)

{
  unsigned_long uVar1;
  bool bVar2;
  char cVar3;
  int32 rhs;
  uint32 value_;
  UdpSocket *pUVar4;
  char *pcVar5;
  ReceivedMessageArgument *pRVar6;
  size_t size;
  socklen_t in_ECX;
  float rhs_00;
  ReceivedMessageArgument RVar7;
  Exception *e;
  MidiMessage local_12c;
  ReceivedMessageArgument local_128;
  undefined1 local_118 [8];
  const_iterator arg;
  undefined1 local_100 [8];
  OutboundPacketStream p;
  char local_a8 [8];
  char host [128];
  IpEndpointName *remoteEndpoint_local;
  ReceivedMessage *m_local;
  ProxyListener *this_local;
  
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->proxy_);
  if (!bVar2) {
    IpEndpointName::AddressAsString(remoteEndpoint,local_a8);
    uVar1 = remoteEndpoint->address;
    IpEndpointName::IpEndpointName((IpEndpointName *)&p.messageIsInProgress_,"localhost",-1);
    if (uVar1 != p._48_8_) {
      std::__cxx11::string::operator=((string *)&this->host_,local_a8);
      connect(this,(int)this + 0x18,(sockaddr *)(ulong)this->port_,in_ECX);
    }
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->proxy_);
  if (bVar2) {
    pUVar4 = &std::__shared_ptr_access<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->proxy_)->super_UdpSocket;
    bVar2 = UdpSocket::IsBound(pUVar4);
    if (bVar2) {
      osc::OutboundPacketStream::OutboundPacketStream
                ((OutboundPacketStream *)local_100,this->buffer_,0x400);
      pcVar5 = osc::ReceivedMessage::AddressPattern(m);
      osc::BeginMessage::BeginMessage((BeginMessage *)&arg.value_.argumentPtr_,pcVar5);
      osc::OutboundPacketStream::operator<<
                ((OutboundPacketStream *)local_100,(BeginMessage *)&arg.value_.argumentPtr_);
      RVar7 = (ReceivedMessageArgument)osc::ReceivedMessage::ArgumentsBegin(m);
      while( true ) {
        arg.value_.typeTagPtr_ = RVar7.argumentPtr_;
        local_118 = (undefined1  [8])RVar7.typeTagPtr_;
        RVar7 = (ReceivedMessageArgument)osc::ReceivedMessage::ArgumentsEnd(m);
        local_128 = RVar7;
        bVar2 = osc::operator!=((ReceivedMessageArgumentIterator *)local_118,
                                (ReceivedMessageArgumentIterator *)&local_128);
        if (!bVar2) break;
        pRVar6 = osc::ReceivedMessageArgumentIterator::operator->
                           ((ReceivedMessageArgumentIterator *)local_118);
        cVar3 = osc::ReceivedMessageArgument::TypeTag(pRVar6);
        switch(cVar3) {
        case 'f':
          pRVar6 = osc::ReceivedMessageArgumentIterator::operator->
                             ((ReceivedMessageArgumentIterator *)local_118);
          rhs_00 = osc::ReceivedMessageArgument::AsFloat(pRVar6);
          osc::OutboundPacketStream::operator<<((OutboundPacketStream *)local_100,rhs_00);
          break;
        default:
          break;
        case 'i':
          pRVar6 = osc::ReceivedMessageArgumentIterator::operator->
                             ((ReceivedMessageArgumentIterator *)local_118);
          rhs = osc::ReceivedMessageArgument::AsInt32(pRVar6);
          osc::OutboundPacketStream::operator<<((OutboundPacketStream *)local_100,rhs);
          break;
        case 'm':
          pRVar6 = osc::ReceivedMessageArgumentIterator::operator->
                             ((ReceivedMessageArgumentIterator *)local_118);
          value_ = osc::ReceivedMessageArgument::AsMidiMessage(pRVar6);
          osc::MidiMessage::MidiMessage(&local_12c,value_);
          osc::OutboundPacketStream::operator<<((OutboundPacketStream *)local_100,&local_12c);
          break;
        case 's':
          pRVar6 = osc::ReceivedMessageArgumentIterator::operator->
                             ((ReceivedMessageArgumentIterator *)local_118);
          pcVar5 = osc::ReceivedMessageArgument::AsString(pRVar6);
          osc::OutboundPacketStream::operator<<((OutboundPacketStream *)local_100,pcVar5);
        }
        osc::ReceivedMessageArgumentIterator::operator++
                  ((ReceivedMessageArgumentIterator *)local_118,0);
        RVar7.argumentPtr_ = arg.value_.typeTagPtr_;
        RVar7.typeTagPtr_ = (char *)local_118;
      }
      osc::OutboundPacketStream::operator<<
                ((OutboundPacketStream *)local_100,(MessageTerminator *)&osc::EndMessage);
      pUVar4 = &std::
                __shared_ptr_access<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->proxy_)->super_UdpSocket;
      pcVar5 = osc::OutboundPacketStream::Data((OutboundPacketStream *)local_100);
      size = osc::OutboundPacketStream::Size((OutboundPacketStream *)local_100);
      UdpSocket::Send(pUVar4,pcVar5,size);
      osc::OutboundPacketStream::~OutboundPacketStream((OutboundPacketStream *)local_100);
    }
  }
  return;
}

Assistant:

void ProcessMessage(const osc::ReceivedMessage &m,
                        const IpEndpointName &remoteEndpoint) override {
        (void) remoteEndpoint; // suppress unused parameter warning

        try {
            if (!proxy_) {
                char host[128];
                remoteEndpoint.AddressAsString(host);
                if (remoteEndpoint.address == IpEndpointName("localhost").address) {
                    ;
                } else {
                    host_=host;
                    connect(host_,port_);
                }
            }
            if(!proxy_ || !proxy_->IsBound()) return;
            osc::OutboundPacketStream p(buffer_, OUTPUT_BUFFER_SIZE);

//            p << osc::BeginBundleImmediate;
            p << osc::BeginMessage(m.AddressPattern());
            osc::ReceivedMessage::const_iterator arg = m.ArgumentsBegin();
            while (arg != m.ArgumentsEnd()) {
                switch (arg->TypeTag()) {
                    case osc::INT32_TYPE_TAG : {
                        p << arg->AsInt32();
                        break;
                    };
                    case osc::FLOAT_TYPE_TAG : {
                        p << arg->AsFloat();
                        break;
                    };
                    case osc::STRING_TYPE_TAG : {
                        p << arg->AsString();
                        break;
                    };
                    case osc::MIDI_MESSAGE_TYPE_TAG : {
                        p << osc::MidiMessage(arg->AsMidiMessage());
                        break;
                    };

                    default:
                        break;
                }
                arg++;
            }


            p << osc::EndMessage;
//            p << osc::EndBundle;


            proxy_->Send(p.Data(), p.Size());
        } catch (osc::Exception &e) {
            // any parsing errors such as unexpected argument types, or
            // missing arguments get thrown as exceptions.
            std::cout << "error while parsing message: "
                      << m.AddressPattern() << ": " << e.what() << "\n";
        }


    }